

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

int os_gets_timeout(uchar *buf,size_t bufl,unsigned_long timeout,int use_timeout)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  long cur_clock;
  os_event_info_t event_info;
  int event_type;
  size_t len;
  osgen_txtwin_t *win;
  long end_time;
  os_event_info_t *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  unsigned_long in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffee8;
  os_event_info_t *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int local_4;
  
  if (os_f_plain == 0) {
    os_gets_begin(in_stack_fffffffffffffee8);
    lVar4 = os_get_sys_clock_ms();
    if (S_default_win == (osgen_txtwin_t *)0x0) {
      local_4 = 5;
    }
    else {
      do {
        if ((in_ECX != 0) && (lVar5 = os_get_sys_clock_ms(), lVar4 + in_RDX <= lVar5)) {
          S_special_cursor_pos = 0;
          return 2;
        }
        if (S_sbmode_win == (osgen_txtwin_t *)0x0) {
          ossloc(0,0x225e2f);
        }
        else {
          ossloc(0,0x225e1c);
        }
        iVar1 = os_get_event(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                             in_stack_fffffffffffffeb8);
        if (iVar1 == 2) {
          S_special_cursor_pos = 0;
          return 2;
        }
        if (iVar1 == 4) {
          S_special_cursor_pos = 0;
          return 4;
        }
        if (iVar1 == 5) {
          S_special_cursor_pos = 0;
          S_gets_in_progress = 0;
          return 5;
        }
        iVar1 = os_gets_process(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      } while (iVar1 == 0);
      strcpy(in_RDI,S_gets_buf);
      *S_gets_buf = '\0';
      S_gets_in_progress = 0;
      local_4 = 6;
    }
  }
  else {
    fflush(_stdout);
    if (in_ECX == 0) {
      pcVar2 = fgets(in_RDI,in_ESI,_stdin);
      if (pcVar2 == (char *)0x0) {
        local_4 = 5;
      }
      else {
        sVar3 = strlen(in_RDI);
        if ((sVar3 != 0) && (in_RDI[sVar3 - 1] == '\n')) {
          in_RDI[sVar3 - 1] = '\0';
        }
        local_4 = 6;
      }
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

int os_gets_timeout(unsigned char *buf, size_t bufl,
                    unsigned long timeout, int use_timeout)
{
    long end_time;
    osgen_txtwin_t *win;
    
    /* if we're in 'plain' mode, simply use stdio input */
    if (os_f_plain)
    {
        size_t len;

        /* make sure the standard output is flushed */
        fflush(stdout);

        /* we don't support the timeout feature in plain mode */
        if (use_timeout)
            return OS_EVT_NOTIMEOUT;

        /* 
         *   get input from stdio, and translate the result code - if gets()
         *   returns null, it indicates an error of some kind, so return an
         *   end-of-file indication 
         */
        if (fgets((char *)buf, bufl, stdin) == 0)
            return OS_EVT_EOF;

        /* remove the trailing newline from the buffer, if present */
        if ((len = strlen((char *)buf)) != 0 && buf[len-1] == '\n')
            buf[len-1] = '\0';

        /* indicate that we read a line */
        return OS_EVT_LINE;
    }

    /* begin input editing mode */
    os_gets_begin(bufl);

    /*
     *   If we have a timeout, calculate the system clock time at which the
     *   timeout expires.  This is simply the current system clock time plus
     *   the timeout interval.  Since we might need to process a series of
     *   events, we'll need to know how much time remains at each point we
     *   get a new event.  
     */
    end_time = os_get_sys_clock_ms() + timeout;
    
    /* use the default window for input */
    if ((win = S_default_win) == 0)
        return OS_EVT_EOF;

    /* process keystrokes until we're done entering the command */
    for ( ;; )
    {
        int event_type;
        os_event_info_t event_info;
        
        /* if we're using a timeout, check for expiration */
        if (use_timeout)
        {
            long cur_clock;

            /* note the current system clock time */
            cur_clock = os_get_sys_clock_ms();

            /* 
             *   if we're past the timeout expiration time already,
             *   interrupt with timeout now 
             */
            if (cur_clock >= end_time)
                goto timeout_expired;

            /* note the interval remaining to the timeout expiration */
            timeout = end_time - cur_clock;
        }
        
        /* move to the proper position on the screen before pausing */
        if (S_sbmode_win != 0)
            ossloc(S_sbmode_win->base.winy, S_sbmode_win->base.winx);
        else
            ossloc(S_gets_y, S_gets_x);

        /* get an event */
        event_type = os_get_event(timeout, use_timeout, &event_info);

        /* handle the event according to the event type */
        switch(event_type)
        {
        case OS_EVT_TIMEOUT:
        timeout_expired:
            /* done with the overridden cursor position */
            S_special_cursor_pos = FALSE;

            /* return the timeout status to the caller */
            return OS_EVT_TIMEOUT;

        case OS_EVT_NOTIMEOUT:
            /* 
             *   we can't handle events with timeouts, so we can't provide
             *   line reading with timeouts, either
             */
            S_special_cursor_pos = FALSE;
            return OS_EVT_NOTIMEOUT;

        case OS_EVT_EOF:
            /* end of file - end input and return the EOF to our caller */
            S_special_cursor_pos = FALSE;
            S_gets_in_progress = FALSE;
            return OS_EVT_EOF;

        default:
            /* process anything else through the input line editor */
            if (os_gets_process(event_type, &event_info))
            {
                /* 
                 *   Copy the result to the caller's buffer.  Note that we
                 *   know the result will fit, because we always limit the
                 *   editing process to the caller's buffer size.  
                 */
                strcpy((char *)buf, S_gets_buf);

                /* clear the input buffer */
                S_gets_buf[0] = '\0';

                /* input is no longer in progress */
                S_gets_in_progress = FALSE;

                /* return success */
                return OS_EVT_LINE;
            }
            break;
        }
    }
}